

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::anon_unknown_0::ComputeTangentsAndBinormals
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *texcoords,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals,
               bool is_facevarying_input,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *tangents,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *binormals,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *out_vertex_indices,string *err)

{
  undefined4 uVar1;
  pointer paVar2;
  pointer paVar3;
  uint *puVar4;
  pointer paVar5;
  pointer paVar6;
  pointer paVar7;
  pointer paVar8;
  pointer puVar9;
  undefined4 uVar10;
  uint uVar11;
  ostream *poVar12;
  pointer puVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *pvVar17;
  uint *puVar18;
  long lVar19;
  size_t __n;
  array<float,_3UL> *__args;
  array<float,_2UL> *__args_00;
  char cVar20;
  uint uVar21;
  int iVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  pointer pnVar27;
  ulong uVar28;
  undefined7 in_register_00000089;
  long lVar29;
  uint *puVar30;
  ulong uVar31;
  uint *puVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  normal3f nVar50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_point_indices;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> v_tn;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> bn;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> tn;
  normal3f local_2d8;
  float local_2cc;
  undefined1 local_2c8 [24];
  pointer paStack_2b0;
  pointer local_2a8;
  pointer paStack_2a0;
  pointer local_298;
  pointer paStack_290;
  pointer local_288;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *local_280;
  ulong local_278;
  uint local_26c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  pointer local_248;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *local_240;
  undefined1 local_238 [8];
  pointer puStack_230;
  pointer local_228;
  undefined1 local_218 [24];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> vStack_200;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_1e8 [2];
  ios_base local_1a8 [272];
  ulong local_98;
  long local_90;
  pointer local_88;
  ulong local_80;
  pointer local_78;
  pointer local_70;
  ulong local_68;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> local_60;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> local_48;
  
  if (tangents == (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
    poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x74f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
    pcVar23 = "tangents arg is nullptr.";
    lVar19 = 0x18;
LAB_00351dc9:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar23,lVar19);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\n",1);
    if (err == (string *)0x0) goto LAB_00351e28;
    ::std::__cxx11::stringbuf::str();
  }
  else {
    if (binormals == (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0
       ) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x753);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      pcVar23 = "binormals arg is nullptr.";
      lVar19 = 0x19;
      goto LAB_00351dc9;
    }
    if (out_vertex_indices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x757);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      pcVar23 = "out_indices arg is nullptr.";
      lVar19 = 0x1b;
      goto LAB_00351dc9;
    }
    paVar2 = (vertices->
             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar3 = (vertices->
             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (paVar2 == paVar3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x75b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      pcVar23 = "vertices is empty.";
LAB_00351dc4:
      lVar19 = 0x12;
      goto LAB_00351dc9;
    }
    puVar18 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar31 = (long)puVar4 - (long)puVar18 >> 2;
    if (uVar31 < 3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x760);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      pcVar23 = "faceVertexIndices.size < 3";
      lVar19 = 0x1a;
      goto LAB_00351dc9;
    }
    local_2cc = (float)CONCAT71(in_register_00000089,is_facevarying_input);
    paVar5 = (texcoords->
             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar6 = (texcoords->
             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (paVar5 == paVar6) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x764);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      pcVar23 = "texcoords is empty";
      goto LAB_00351dc4;
    }
    paVar7 = (normals->
             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar8 = (normals->
             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    local_240 = normals;
    if (paVar7 == paVar8) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
      poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x768);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      pcVar23 = "normals is empty";
      lVar19 = 0x10;
      goto LAB_00351dc9;
    }
    local_280 = texcoords;
    if (is_facevarying_input) {
      if (((long)paVar3 - (long)paVar2 >> 2) * -0x5555555555555555 - uVar31 == 0) {
        if ((long)paVar6 - (long)paVar5 >> 3 != uVar31) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
          iVar22 = 0x770;
          goto LAB_00352afb;
        }
        if (((long)paVar8 - (long)paVar7 >> 2) * -0x5555555555555555 - uVar31 == 0)
        goto LAB_00351f86;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
        iVar22 = 0x773;
LAB_00352c92:
        poVar12 = (ostream *)::std::ostream::operator<<(local_218,iVar22);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        pcVar23 = "Invalid normals.size.";
        lVar19 = 0x15;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x76d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        pcVar23 = "Invalid vertices.size.";
        lVar19 = 0x16;
      }
      goto LAB_00351dc9;
    }
    puVar32 = puVar18 + 1;
    puVar30 = puVar18;
    if (puVar32 != puVar4 && puVar18 != puVar4) {
      do {
        puVar18 = puVar32;
        if (*puVar32 <= *puVar30) {
          puVar18 = puVar30;
        }
        puVar32 = puVar32 + 1;
        puVar30 = puVar18;
      } while (puVar32 != puVar4);
    }
    uVar31 = (ulong)*puVar18;
    uVar24 = ((long)paVar3 - (long)paVar2 >> 2) * -0x5555555555555555;
    if (uVar31 <= uVar24 && uVar24 - uVar31 != 0) {
      if (uVar31 < (ulong)((long)paVar6 - (long)paVar5 >> 3)) {
        uVar24 = ((long)paVar8 - (long)paVar7 >> 2) * -0x5555555555555555;
        if (uVar24 < uVar31 || uVar24 - uVar31 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
          iVar22 = 0x77f;
          goto LAB_00352c92;
        }
LAB_00351f86:
        local_70 = (faceVertexCounts->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_78 = (faceVertexCounts->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        if ((local_78 != local_70) ||
           ((ulong)(((long)(faceVertexIndices->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(faceVertexIndices->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
            0x5555555555555556)) {
          ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
          vector(&local_48,
                 (long)(faceVertexIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(faceVertexIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2,(allocator_type *)local_218);
          __n = (long)local_48.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          if (__n != 0) {
            memset(local_48.
                   super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                   ._M_impl.super__Vector_impl_data._M_start,0,__n);
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            vector(&local_60,
                   (long)(faceVertexIndices->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(faceVertexIndices->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2,(allocator_type *)local_218);
            fVar37 = local_2cc;
            __n = (long)local_60.
                        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_60.
                        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            if (__n != 0) {
              pnVar27 = local_60.
                        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              memset(local_60.
                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,__n);
              puVar13 = (faceVertexCounts->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              bVar36 = (faceVertexCounts->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish == puVar13;
              cVar20 = SUB41(fVar37,0);
              if (!bVar36) {
                uVar24 = 0;
                uVar31 = 0;
                do {
                  uVar16 = 3;
                  if (local_78 != local_70) {
                    uVar16 = (ulong)puVar13[uVar24];
                  }
                  uVar33 = uVar16 + uVar31;
                  puVar13 = (faceVertexIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  local_278 = uVar24;
                  if (uVar33 < (ulong)((long)(faceVertexIndices->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)puVar13 >> 2)) {
                    if ((uint)uVar16 < 3) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_218,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_218,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_218,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_218,"():",3);
                      poVar12 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_218,0x7a1);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_218,"Degenerated facet found.",0x18);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_218,"\n",1);
                      if (err != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::__cxx11::string::_M_append((char *)err,local_2c8._0_8_);
                        if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
                          operator_delete((void *)local_2c8._0_8_,
                                          (ulong)((long)(float *)local_2c8._16_8_ + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                      ::std::ios_base::~ios_base(local_1a8);
                      pnVar27 = (pointer)0x0;
                      uVar33 = uVar31;
                    }
                    else {
                      local_68 = uVar16 - 2;
                      pnVar27 = (pointer)CONCAT71((int7)((ulong)pnVar27 >> 8),local_68 == 0);
                      if (local_68 != 0) {
                        paVar2 = (vertices->
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        uVar34 = ((long)(vertices->
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)paVar2
                                 >> 2) * -0x5555555555555555;
                        local_88 = (local_280->
                                   super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                        local_80 = (long)(local_280->
                                         super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88 >> 3;
                        lVar19 = uVar31 * 0xc;
                        local_90 = 2 - uVar16;
                        local_248 = puVar13 + uVar31;
                        uVar24 = 1;
                        lVar29 = 6;
                        do {
                          iVar15 = (int)uVar24;
                          iVar22 = (int)uVar31;
                          if (cVar20 == '\0') {
                            uVar11 = local_248[uVar24 - 1];
                            uVar21 = local_248[uVar24];
                          }
                          else {
                            uVar11 = (iVar22 + iVar15) - 1;
                            uVar21 = iVar22 + iVar15;
                          }
                          local_26c = (uint)pnVar27;
                          if (cVar20 == '\0') {
                            uVar26 = local_248[uVar24 + 1];
                          }
                          else {
                            uVar26 = iVar22 + iVar15 + 1;
                          }
                          uVar16 = (ulong)uVar11;
                          local_98 = uVar33;
                          if (((uVar34 < uVar16 || uVar34 - uVar16 == 0) ||
                              (uVar28 = (ulong)uVar21, uVar34 < uVar28 || uVar34 - uVar28 == 0)) ||
                             (uVar25 = (ulong)uVar26, uVar34 < uVar25 || uVar34 - uVar25 == 0)) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       ,0x5b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,"():",3);
                            poVar12 = (ostream *)
                                      ::std::ostream::operator<<((ostringstream *)local_218,0x7c2);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                            lVar19 = 0x40;
                            pcVar23 = 
                            "Invalid value in faceVertexIndices. some exceeds vertices.size()";
LAB_003527cc:
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,pcVar23,lVar19);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,"\n",1);
                            if (err != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::__cxx11::string::_M_append((char *)err,local_2c8._0_8_);
                              if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
                                operator_delete((void *)local_2c8._0_8_,
                                                (ulong)((long)(float *)local_2c8._16_8_ + 1));
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_218);
                            ::std::ios_base::~ios_base(local_1a8);
                            pnVar27 = (pointer)(ulong)local_26c;
                            uVar33 = uVar31;
                            break;
                          }
                          if (((local_80 <= uVar25) || (local_80 <= uVar16)) || (local_80 <= uVar28)
                             ) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       ,0x5b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218,"():",3);
                            poVar12 = (ostream *)
                                      ::std::ostream::operator<<((ostringstream *)local_218,0x7df);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                            lVar19 = 0x2c;
                            pcVar23 = "Invalid index. some exceeds texcoords.size()";
                            goto LAB_003527cc;
                          }
                          fVar38 = local_88[uVar28]._M_elems[0] - local_88[uVar16]._M_elems[0];
                          fVar44 = local_88[uVar25]._M_elems[0] - local_88[uVar16]._M_elems[0];
                          fVar43 = local_88[uVar28]._M_elems[1] - local_88[uVar16]._M_elems[1];
                          fVar37 = local_88[uVar25]._M_elems[1] - local_88[uVar16]._M_elems[1];
                          fVar39 = fVar38 * fVar37 - fVar43 * fVar44;
                          if (1e-20 < ABS(fVar39)) {
                            fVar39 = 1.0 / fVar39;
                          }
                          else {
                            fVar39 = 1.0;
                          }
                          fVar48 = paVar2[uVar28]._M_elems[0] - paVar2[uVar16]._M_elems[0];
                          fVar41 = paVar2[uVar25]._M_elems[0] - paVar2[uVar16]._M_elems[0];
                          fVar46 = paVar2[uVar28]._M_elems[1] - paVar2[uVar16]._M_elems[1];
                          fVar42 = paVar2[uVar25]._M_elems[1] - paVar2[uVar16]._M_elems[1];
                          fVar45 = paVar2[uVar28]._M_elems[2] - paVar2[uVar16]._M_elems[2];
                          fVar40 = paVar2[uVar25]._M_elems[2] - paVar2[uVar16]._M_elems[2];
                          fVar47 = (fVar37 * fVar48 - fVar41 * fVar43) * fVar39;
                          fVar49 = (fVar37 * fVar46 - fVar42 * fVar43) * fVar39;
                          fVar37 = (fVar37 * fVar45 - fVar43 * fVar40) * fVar39;
                          fVar43 = (fVar41 * fVar38 - fVar48 * fVar44) * fVar39;
                          fVar41 = (fVar42 * fVar38 - fVar46 * fVar44) * fVar39;
                          fVar39 = (fVar40 * fVar38 - fVar45 * fVar44) * fVar39;
                          (&local_48.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31 - 2].x)[lVar29] =
                               fVar47;
                          *(float *)((long)local_48.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -0x14) = fVar49;
                          *(float *)((long)local_48.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -0x10) = fVar37;
                          (&local_48.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31 - 1].x)[lVar29] =
                               fVar47;
                          *(float *)((long)local_48.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -8) = fVar49;
                          *(float *)((long)local_48.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -4) = fVar37;
                          (&local_48.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31].x)[lVar29] = fVar47;
                          (&local_48.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31].y)[lVar29] = fVar49;
                          (&local_48.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31].z)[lVar29] = fVar37;
                          (&local_60.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31 - 2].x)[lVar29] =
                               fVar43;
                          *(float *)((long)local_60.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -0x14) = fVar41;
                          *(float *)((long)local_60.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -0x10) = fVar39;
                          (&local_60.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31 - 1].x)[lVar29] =
                               fVar43;
                          *(float *)((long)local_60.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -8) = fVar41;
                          *(float *)((long)local_60.
                                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar29 * 4 + lVar19 + -4) = fVar39;
                          (&local_60.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31].x)[lVar29] = fVar43;
                          (&local_60.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31].y)[lVar29] = fVar41;
                          (&local_60.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar31].z)[lVar29] = fVar39;
                          pnVar27 = (pointer)CONCAT71((int7)((ulong)local_88 >> 8),
                                                      local_68 <= uVar24);
                          lVar14 = local_90 + uVar24;
                          uVar24 = uVar24 + 1;
                          lVar29 = lVar29 + 3;
                        } while (lVar14 != 0);
                      }
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"():",3);
                    poVar12 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_218,0x79d);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"Invalid value in faceVertexOffset.",0x22);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"\n",1);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append((char *)err,local_2c8._0_8_);
                      if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
                        operator_delete((void *)local_2c8._0_8_,
                                        (ulong)((long)(float *)local_2c8._16_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                    ::std::ios_base::~ios_base(local_1a8);
                    pnVar27 = (pointer)0x0;
                    uVar33 = uVar31;
                  }
                  if (((ulong)pnVar27 & 1) == 0) goto LAB_003533d6;
                  uVar24 = local_278 + 1;
                  puVar13 = (faceVertexCounts->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  bVar35 = uVar24 < (ulong)((long)(faceVertexCounts->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)puVar13 >> 2);
                  bVar36 = !bVar35;
                  uVar31 = uVar33;
                } while (bVar35);
              }
              local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (uint *)0x0;
              local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (uint *)0x0;
              local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1e8[0].
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (array<float,_2UL> *)0x0;
              local_1e8[0].
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1e8[0].
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (array<float,_2UL> *)0x0;
              vStack_200.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (array<float,_3UL> *)0x0;
              vStack_200.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (array<float,_3UL> *)0x0;
              local_218._16_8_ = (pointer)0x0;
              vStack_200.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_218._0_8_ = (pointer)0x0;
              local_218._8_8_ = (pointer)0x0;
              local_288 = (pointer)0x0;
              local_298 = (pointer)0x0;
              paStack_290 = (pointer)0x0;
              local_2a8 = (pointer)0x0;
              paStack_2a0 = (pointer)0x0;
              local_2c8._16_8_ = (pointer)0x0;
              paStack_2b0 = (pointer)0x0;
              local_2c8._0_8_ = (pointer)0x0;
              local_2c8._8_8_ = (pointer)0x0;
              puVar13 = (faceVertexIndices->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              puVar9 = (faceVertexIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              if (cVar20 == '\0') {
                if (puVar9 != puVar13) {
                  uVar31 = 0;
                  pvVar17 = local_280;
                  do {
                    if (local_218._8_8_ == local_218._16_8_) {
                      ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_218,
                                 (iterator)local_218._8_8_,puVar13 + uVar31);
                      pvVar17 = local_280;
                    }
                    else {
                      *(uint *)local_218._8_8_ = puVar13[uVar31];
                      local_218._8_8_ = local_218._8_8_ + 4;
                    }
                    __args = (local_240->
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start +
                             (faceVertexIndices->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar31];
                    if (vStack_200.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        vStack_200.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      ::std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>::
                      _M_realloc_insert<std::array<float,3ul>const&>
                                ((vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                  *)&vStack_200,
                                 (iterator)
                                 vStack_200.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,__args);
                      pvVar17 = local_280;
                    }
                    else {
                      (vStack_200.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[2] =
                           __args->_M_elems[2];
                      *(undefined8 *)
                       (vStack_200.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_elems =
                           *(undefined8 *)__args->_M_elems;
                      vStack_200.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           vStack_200.
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    __args_00 = (pvVar17->
                                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start +
                                (faceVertexIndices->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start[uVar31];
                    if (local_1e8[0].
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        local_1e8[0].
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      ::std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
                      _M_realloc_insert<std::array<float,2ul>const&>
                                ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>
                                  *)local_1e8,
                                 (iterator)
                                 local_1e8[0].
                                 super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,__args_00);
                      pvVar17 = local_280;
                    }
                    else {
                      *(undefined8 *)
                       (local_1e8[0].
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_elems =
                           *(undefined8 *)__args_00->_M_elems;
                      local_1e8[0].
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           local_1e8[0].
                           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar31 = uVar31 + 1;
                    puVar13 = (faceVertexIndices->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                  } while (uVar31 < (ulong)((long)(faceVertexIndices->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)puVar13 >> 2));
                }
              }
              else {
                if (puVar9 != puVar13) {
                  lVar19 = 0;
                  uVar31 = 0;
                  do {
                    if (local_218._8_8_ == local_218._16_8_) {
                      ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_218,
                                 (iterator)local_218._8_8_,(uint *)((long)puVar13 + lVar19));
                    }
                    else {
                      *(uint *)local_218._8_8_ = *(uint *)((long)puVar13 + lVar19);
                      local_218._8_8_ = local_218._8_8_ + 4;
                    }
                    uVar31 = uVar31 + 1;
                    puVar13 = (faceVertexIndices->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    lVar19 = lVar19 + 4;
                  } while (uVar31 < (ulong)((long)(faceVertexIndices->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)puVar13 >> 2));
                }
                ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator=(&vStack_200,local_240);
                ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                operator=(local_1e8,local_280);
              }
              local_238 = (undefined1  [8])0x0;
              puStack_230 = (pointer)0x0;
              local_228 = (pointer)0x0;
              BuildIndices<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexDataHasher,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexDataEqual>
                        ((ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_218,
                         (ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_2c8,&local_268,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238);
              if (local_238 != (undefined1  [8])0x0) {
                operator_delete((void *)local_238,(long)local_228 - (long)local_238);
              }
              ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
              ::~ComputeTangentVertexOutput
                        ((ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_2c8);
              ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
              ::~ComputeTangentVertexInput
                        ((ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_218);
              puVar18 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1;
              puVar13 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (puVar18 !=
                  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
                  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                do {
                  puVar4 = puVar18;
                  if (*puVar18 <= *puVar13) {
                    puVar4 = puVar13;
                  }
                  puVar13 = puVar4;
                  puVar18 = puVar18 + 1;
                } while (puVar18 !=
                         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              }
              uVar31 = (ulong)*puVar13;
              local_218._16_8_ = (pointer)0x0;
              local_218._0_8_ = (pointer)0x0;
              local_218._8_8_ = (pointer)0x0;
              local_2c8._0_8_ = (pointer)0x0;
              local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffff00000000;
              ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
              _M_fill_assign((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              *)local_218,uVar31,(value_type *)local_2c8);
              local_2c8._16_8_ = (pointer)0x0;
              local_2c8._0_8_ = (pointer)0x0;
              local_2c8._8_8_ = (pointer)0x0;
              local_238 = (undefined1  [8])0x0;
              puStack_230 = (pointer)((ulong)puStack_230 & 0xffffffff00000000);
              ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
              _M_fill_assign((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              *)local_2c8,uVar31,(value_type *)local_238);
              if ((long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start != 0) {
                lVar19 = (long)local_268.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_268.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                lVar29 = 0;
                do {
                  uVar11 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar29];
                  fVar37 = local_48.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11].y;
                  fVar38 = local_48.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11].z;
                  fVar44 = local_60.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11].x;
                  fVar39 = local_60.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11].y;
                  fVar43 = local_60.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11].z;
                  ((pointer)(local_218._0_8_ + (ulong)uVar11 * 0xc))->x =
                       local_48.
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].x +
                       ((pointer)(local_218._0_8_ + (ulong)uVar11 * 0xc))->x;
                  ((pointer)(local_218._0_8_ + (ulong)uVar11 * 0xc))->y =
                       fVar37 + ((pointer)(local_218._0_8_ + (ulong)uVar11 * 0xc))->y;
                  ((pointer)(local_218._0_8_ + (ulong)uVar11 * 0xc))->z =
                       fVar38 + ((pointer)(local_218._0_8_ + (ulong)uVar11 * 0xc))->z;
                  ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->x =
                       fVar44 + ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->x;
                  ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->y =
                       fVar39 + ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->y;
                  ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->z =
                       fVar43 + ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->z;
                  lVar29 = lVar29 + 1;
                } while (lVar19 + (ulong)(lVar19 == 0) != lVar29);
              }
              if (uVar31 != 0) {
                lVar19 = 0;
                do {
                  fVar37 = vlength((normal3f *)((long)(float *)local_218._0_8_ + lVar19));
                  if (0.0 < fVar37) {
                    nVar50 = vnormalize((normal3f *)((long)(float *)local_218._0_8_ + lVar19),
                                        1.1920929e-07);
                    *(long *)((long)(float *)local_218._0_8_ + lVar19) = nVar50._0_8_;
                    *(float *)((long)(local_218._0_8_ + 8) + lVar19) = nVar50.z;
                  }
                  fVar37 = vlength((normal3f *)((long)(float *)local_2c8._0_8_ + lVar19));
                  if (0.0 < fVar37) {
                    nVar50 = vnormalize((normal3f *)((long)(float *)local_2c8._0_8_ + lVar19),
                                        1.1920929e-07);
                    *(long *)((long)(float *)local_2c8._0_8_ + lVar19) = nVar50._0_8_;
                    *(float *)((long)(local_2c8._0_8_ + 8) + lVar19) = nVar50.z;
                  }
                  lVar19 = lVar19 + 0xc;
                } while (uVar31 * 0xc != lVar19);
              }
              local_238 = (undefined1  [8])0x0;
              puStack_230 = (pointer)((ulong)puStack_230 & 0xffffffff00000000);
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              _M_fill_assign(tangents,uVar31,(value_type *)local_238);
              local_238 = (undefined1  [8])0x0;
              puStack_230 = (pointer)((ulong)puStack_230 & 0xffffffff00000000);
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              _M_fill_assign(binormals,uVar31,(value_type *)local_238);
              if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar31 = 0;
                do {
                  uVar11 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar31];
                  paVar2 = (local_240->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_238._0_4_ = paVar2[uVar11]._M_elems[0];
                  local_238._4_4_ = paVar2[uVar11]._M_elems[1];
                  fVar37 = paVar2[uVar11]._M_elems[2];
                  puStack_230 = (pointer)CONCAT44(puStack_230._4_4_,fVar37);
                  uVar1 = ((pointer)
                          (local_218._0_8_ +
                          (ulong)local_268.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar31] * 0xc))->x;
                  uVar10 = ((pointer)
                           (local_218._0_8_ +
                           (ulong)local_268.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar31] * 0xc))->y;
                  uVar11 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar31];
                  local_2cc = ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->x;
                  fVar38 = ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->y;
                  local_280 = (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               *)CONCAT44(local_280._4_4_,
                                          ((pointer)(local_2c8._0_8_ + (ulong)uVar11 * 0xc))->z);
                  fVar44 = fVar37 * ((pointer)
                                    (local_218._0_8_ +
                                    (ulong)local_268.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar31] * 0xc))
                                    ->z +
                           (float)local_238._0_4_ * (float)uVar1 +
                           (float)local_238._4_4_ * (float)uVar10;
                  local_2d8.z = ((pointer)
                                (local_218._0_8_ +
                                (ulong)local_268.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar31] * 0xc))->z
                                - fVar44 * fVar37;
                  local_2d8._0_8_ =
                       CONCAT44((float)uVar10 - (float)local_238._4_4_ * fVar44,
                                (float)uVar1 - (float)local_238._0_4_ * fVar44);
                  fVar37 = vlength(&local_2d8);
                  if (0.0 < fVar37) {
                    nVar50 = vnormalize(&local_2d8,1.1920929e-07);
                    local_2d8.z = nVar50.z;
                    local_2d8._0_8_ = nVar50._0_8_;
                  }
                  nVar50 = vcross((normal3f *)local_238,&local_2d8);
                  if (nVar50.z * local_280._0_4_ + nVar50.x * local_2cc + nVar50.y * fVar38 < 0.0) {
                    local_2d8.z = -local_2d8.z;
                    local_2d8._0_8_ = local_2d8._0_8_ ^ 0x8000000080000000;
                  }
                  uVar11 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar31];
                  paVar2 = (tangents->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  paVar2[uVar11]._M_elems[0] = local_2d8.x;
                  paVar2[uVar11]._M_elems[1] = local_2d8.y;
                  paVar2[uVar11]._M_elems[2] = local_2d8.z;
                  paVar2 = (binormals->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  paVar2[uVar11]._M_elems[0] = local_2cc;
                  paVar2[uVar11]._M_elems[1] = fVar38;
                  paVar2[uVar11]._M_elems[2] = local_280._0_4_;
                  uVar31 = uVar31 + 1;
                } while (uVar31 < (ulong)((long)local_268.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_268.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2));
              }
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (out_vertex_indices,&local_268);
              if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
              }
              if ((pointer)local_218._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
              }
              if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
                operator_delete(local_268.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_268.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_268.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
LAB_003533d6:
              if (local_60.
                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.
                                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.
                                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_48.
                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                return bVar36;
              }
              operator_delete(local_48.
                              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.
                                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.
                                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              return bVar36;
            }
          }
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     ((long)__n >> 2) * -0x5555555555555555);
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
        poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x789);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        pcVar23 = 
        "Invalid faceVertexIndices. It must be all triangles: faceVertexIndices.size % 3 == 0";
        lVar19 = 0x54;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
        iVar22 = 0x77c;
LAB_00352afb:
        poVar12 = (ostream *)::std::ostream::operator<<(local_218,iVar22);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        pcVar23 = "Invalid texcoords.size.";
        lVar19 = 0x17;
      }
      goto LAB_00351dc9;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"ComputeTangentsAndBinormals",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
    poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0x779);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Invalid vertices.size.",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\n",1);
    if (err == (string *)0x0) goto LAB_00351e28;
    ::std::__cxx11::stringbuf::str();
  }
  ::std::__cxx11::string::_M_append((char *)err,local_2c8._0_8_);
  if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,(ulong)((long)(float *)local_2c8._16_8_ + 1));
  }
LAB_00351e28:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  ::std::ios_base::~ios_base(local_1a8);
  return false;
}

Assistant:

static bool ComputeTangentsAndBinormals(
    const std::vector<vec3> &vertices,
    const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices,
    const std::vector<vec2> &texcoords, const std::vector<vec3> &normals,
    bool is_facevarying_input,  // false: 'vertex' varying
    std::vector<vec3> *tangents, std::vector<vec3> *binormals,
    std::vector<uint32_t> *out_vertex_indices, std::string *err) {
  if (!tangents) {
    PUSH_ERROR_AND_RETURN("tangents arg is nullptr.");
  }

  if (!binormals) {
    PUSH_ERROR_AND_RETURN("binormals arg is nullptr.");
  }

  if (!out_vertex_indices) {
    PUSH_ERROR_AND_RETURN("out_indices arg is nullptr.");
  }

  if (vertices.empty()) {
    PUSH_ERROR_AND_RETURN("vertices is empty.");
  }

  // At least 1 triangle face should exist.
  if (faceVertexIndices.size() < 3) {
    PUSH_ERROR_AND_RETURN("faceVertexIndices.size < 3");
  }

  if (texcoords.empty()) {
    PUSH_ERROR_AND_RETURN("texcoords is empty");
  }

  if (normals.empty()) {
    PUSH_ERROR_AND_RETURN("normals is empty");
  }

  if (is_facevarying_input) {
    if (vertices.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid vertices.size.");
    }
    if (texcoords.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid texcoords.size.");
    }
    if (normals.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid normals.size.");
    }
  } else {
    uint32_t max_vert_index =
        *std::max_element(faceVertexIndices.begin(), faceVertexIndices.end());
    if (max_vert_index >= vertices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid vertices.size.");
    }
    if (max_vert_index >= texcoords.size()) {
      PUSH_ERROR_AND_RETURN("Invalid texcoords.size.");
    }
    if (max_vert_index >= normals.size()) {
      PUSH_ERROR_AND_RETURN("Invalid normals.size.");
    }
  }

  bool hasFaceVertexCounts = true;
  if (faceVertexCounts.size() == 0) {
    // Assume all triangle faces.
    if ((faceVertexIndices.size() % 3) != 0) {
      PUSH_ERROR_AND_RETURN(
          "Invalid faceVertexIndices. It must be all triangles: "
          "faceVertexIndices.size % 3 == 0");
    }
    hasFaceVertexCounts = false;
  }

  // tn, bn = facevarying
  std::vector<value::normal3f> tn(faceVertexIndices.size());
  memset(&tn.at(0), 0, sizeof(value::normal3f) * tn.size());
  std::vector<value::normal3f> bn(faceVertexIndices.size());
  memset(&bn.at(0), 0, sizeof(value::normal3f) * bn.size());

  //
  // 1. Compute facevarying tangent/binormal for each faceVertex.
  //
  size_t faceVertexIndexOffset{0};
  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t nv = hasFaceVertexCounts ? faceVertexCounts[i] : 3;

    if ((faceVertexIndexOffset + nv) >= faceVertexIndices.size()) {
      // Invalid faceVertexIndices
      PUSH_ERROR_AND_RETURN("Invalid value in faceVertexOffset.");
    }

    if (nv < 3) {
      PUSH_ERROR_AND_RETURN("Degenerated facet found.");
    }

    // Process each two-edges per facet.
    //
    // Example:
    //
    // fv3
    //  o----------------o fv2
    //   \              /
    //    \            /
    //     o----------o
    //    fv0         fv1

    // facet0:  fv0, fv1, fv2
    // facet1:  fv1, fv2, fv3

    for (size_t f = 0; f < nv - 2; f++) {
      size_t fid0 = faceVertexIndexOffset + f;
      size_t fid1 = faceVertexIndexOffset + f + 1;
      size_t fid2 = faceVertexIndexOffset + f + 2;

      uint32_t vf0 =
          is_facevarying_input ? uint32_t(fid0) : faceVertexIndices[fid0];
      uint32_t vf1 =
          is_facevarying_input ? uint32_t(fid1) : faceVertexIndices[fid1];
      uint32_t vf2 =
          is_facevarying_input ? uint32_t(fid2) : faceVertexIndices[fid2];

      if ((vf0 >= vertices.size()) || (vf1 >= vertices.size()) ||
          (vf2 >= vertices.size())) {
        // index out-of-range
        PUSH_ERROR_AND_RETURN(
            "Invalid value in faceVertexIndices. some exceeds vertices.size()");
      }

      vec3 v1 = vertices[vf0];
      vec3 v2 = vertices[vf1];
      vec3 v3 = vertices[vf2];

      float v1x = v1[0];
      float v1y = v1[1];
      float v1z = v1[2];

      float v2x = v2[0];
      float v2y = v2[1];
      float v2z = v2[2];

      float v3x = v3[0];
      float v3y = v3[1];
      float v3z = v3[2];

      float w1x = 0.0f;
      float w1y = 0.0f;
      float w2x = 0.0f;
      float w2y = 0.0f;
      float w3x = 0.0f;
      float w3y = 0.0f;

      if ((vf0 >= texcoords.size()) || (vf1 >= texcoords.size()) ||
          (vf2 >= texcoords.size())) {
        // index out-of-range
        PUSH_ERROR_AND_RETURN("Invalid index. some exceeds texcoords.size()");
      }

      {
        vec2 uv1 = texcoords[vf0];
        vec2 uv2 = texcoords[vf1];
        vec2 uv3 = texcoords[vf2];

        w1x = uv1[0];
        w1y = uv1[1];
        w2x = uv2[0];
        w2y = uv2[1];
        w3x = uv3[0];
        w3y = uv3[1];
      }

      float x1 = v2x - v1x;
      float x2 = v3x - v1x;
      float y1 = v2y - v1y;
      float y2 = v3y - v1y;
      float z1 = v2z - v1z;
      float z2 = v3z - v1z;

      float s1 = w2x - w1x;
      float s2 = w3x - w1x;
      float t1 = w2y - w1y;
      float t2 = w3y - w1y;

      float r = 1.0;

      if (std::fabs(double(s1 * t2 - s2 * t1)) > 1.0e-20) {
        r /= (s1 * t2 - s2 * t1);
      }

      vec3 tdir{(t2 * x1 - t1 * x2) * r, (t2 * y1 - t1 * y2) * r,
                (t2 * z1 - t1 * z2) * r};
      vec3 bdir{(s1 * x2 - s2 * x1) * r, (s1 * y2 - s2 * y1) * r,
                (s1 * z2 - s2 * z1) * r};

      //
      // NOTE: for quad or polygon mesh, this overwrites previous 2 facevarying
      // points for each face.
      //       And this would not be a good way to compute tangents for
      //       quad/polygon.
      //

      tn[fid0][0] = tdir[0];
      tn[fid0][1] = tdir[1];
      tn[fid0][2] = tdir[2];

      tn[fid1][0] = tdir[0];
      tn[fid1][1] = tdir[1];
      tn[fid1][2] = tdir[2];

      tn[fid2][0] = tdir[0];
      tn[fid2][1] = tdir[1];
      tn[fid2][2] = tdir[2];

      bn[fid0][0] = bdir[0];
      bn[fid0][1] = bdir[1];
      bn[fid0][2] = bdir[2];

      bn[fid1][0] = bdir[0];
      bn[fid1][1] = bdir[1];
      bn[fid1][2] = bdir[2];

      bn[fid2][0] = bdir[0];
      bn[fid2][1] = bdir[1];
      bn[fid2][2] = bdir[2];
    }

    faceVertexIndexOffset += nv;
  }

  //
  // 2. Build indices(use same index for shared-vertex)
  //
  std::vector<uint32_t> vertex_indices;  // len = faceVertexIndices.size()
  {
    ComputeTangentVertexInput<ComputeTangentPackedVertexData> vertex_input;
    ComputeTangentVertexOutput<ComputeTangentPackedVertexData> vertex_output;

    if (is_facevarying_input) {
      // input position is still in 'vertex' variability.
      for (size_t i = 0; i < faceVertexIndices.size(); i++) {
        vertex_input.point_indices.push_back(faceVertexIndices[i]);
      }
      vertex_input.normals = normals;
      vertex_input.uvs = texcoords;
    } else {
      // expand to facevarying.
      for (size_t i = 0; i < faceVertexIndices.size(); i++) {
        vertex_input.point_indices.push_back(faceVertexIndices[i]);
        vertex_input.normals.push_back(normals[faceVertexIndices[i]]);
        vertex_input.uvs.push_back(texcoords[faceVertexIndices[i]]);
      }
    }

    std::vector<uint32_t> vertex_point_indices;

    BuildIndices<ComputeTangentVertexInput<ComputeTangentPackedVertexData>,
                 ComputeTangentVertexOutput<ComputeTangentPackedVertexData>,
                 ComputeTangentPackedVertexData,
                 ComputeTangentPackedVertexDataHasher,
                 ComputeTangentPackedVertexDataEqual>(
        vertex_input, vertex_output, vertex_indices, vertex_point_indices);

    DCOUT("faceVertexIndices.size : " << faceVertexIndices.size());
    DCOUT("# of indices after the build: "
          << vertex_indices.size() << ", reduced "
          << (faceVertexIndices.size() - vertex_indices.size()) << " indices.");
    // We only need indices. Discard vertex_output and vertrex_point_indices
  }

  const uint32_t num_verts =
      *std::max_element(vertex_indices.begin(), vertex_indices.end());

  //
  // 3. normalize * orthogonalize;
  //

  // per-vertex tangents/binormals
  std::vector<value::normal3f> v_tn;
  v_tn.assign(num_verts, {0.0f, 0.0f, 0.0f});

  std::vector<value::normal3f> v_bn;
  v_bn.assign(num_verts, {0.0f, 0.0f, 0.0f});

  for (size_t i = 0; i < vertex_indices.size(); i++) {
    value::normal3f Tn = tn[vertex_indices[i]];
    value::normal3f Bn = bn[vertex_indices[i]];

    v_tn[vertex_indices[i]][0] += Tn[0];
    v_tn[vertex_indices[i]][1] += Tn[1];
    v_tn[vertex_indices[i]][2] += Tn[2];

    v_bn[vertex_indices[i]][0] += Bn[0];
    v_bn[vertex_indices[i]][1] += Bn[1];
    v_bn[vertex_indices[i]][2] += Bn[2];
  }

  for (size_t i = 0; i < size_t(num_verts); i++) {
    if (vlength(v_tn[i]) > 0.0f) {
      v_tn[i] = vnormalize(v_tn[i]);
    }
    if (vlength(v_bn[i]) > 0.0f) {
      v_bn[i] = vnormalize(v_bn[i]);
    }
  }

  tangents->assign(num_verts, {0.0f, 0.0f, 0.0f});
  binormals->assign(num_verts, {0.0f, 0.0f, 0.0f});

  for (size_t i = 0; i < vertex_indices.size(); i++) {
    value::normal3f n;

    // http://www.terathon.com/code/tangent.html

    n[0] = normals[vertex_indices[i]][0];
    n[1] = normals[vertex_indices[i]][1];
    n[2] = normals[vertex_indices[i]][2];

    value::normal3f Tn = v_tn[vertex_indices[i]];
    value::normal3f Bn = v_bn[vertex_indices[i]];

    // Gram-Schmidt orthogonalize
    Tn = (Tn - n * vdot(n, Tn));
    if (vlength(Tn) > 0.0f) {
      Tn = vnormalize(Tn);
    }

    // Calculate handedness
    if (vdot(vcross(n, Tn), Bn) < 0.0f) {
      Tn = Tn * -1.0f;
    }

    ((*tangents)[vertex_indices[i]])[0] = Tn[0];
    ((*tangents)[vertex_indices[i]])[1] = Tn[1];
    ((*tangents)[vertex_indices[i]])[2] = Tn[2];

    ((*binormals)[vertex_indices[i]])[0] = Bn[0];
    ((*binormals)[vertex_indices[i]])[1] = Bn[1];
    ((*binormals)[vertex_indices[i]])[2] = Bn[2];
  }

  (*out_vertex_indices) = vertex_indices;

  return true;
}